

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluShaderLibrary.cpp
# Opt level: O0

void __thiscall
glu::sl::ShaderParser::parseShaderGroup
          (ShaderParser *this,
          vector<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_> *shaderNodeList)

{
  int iVar1;
  char *str;
  undefined4 extraout_var;
  value_type local_b0;
  value_type local_a8;
  TestCaseGroup *groupNode;
  undefined1 local_80 [8];
  vector<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_> children;
  string description;
  string local_38 [8];
  string name;
  vector<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_> *shaderNodeList_local;
  ShaderParser *this_local;
  
  name.field_2._8_8_ = shaderNodeList;
  advanceToken(this,TOKEN_GROUP);
  std::__cxx11::string::string(local_38,(string *)&this->m_curTokenStr);
  advanceToken(this);
  assumeToken(this,TOKEN_STRING);
  str = (char *)std::__cxx11::string::c_str();
  parseStringLiteral_abi_cxx11_
            ((string *)
             &children.super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>._M_impl
              .super__Vector_impl_data._M_end_of_storage,this,str);
  advanceToken(this,TOKEN_STRING);
  std::vector<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>::vector
            ((vector<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_> *)local_80);
  while (this->m_curToken != TOKEN_END) {
    if (this->m_curToken == TOKEN_GROUP) {
      parseShaderGroup(this,(vector<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_> *)local_80);
    }
    else if (this->m_curToken == TOKEN_CASE) {
      parseShaderCase(this,(vector<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_> *)local_80);
    }
    else if (this->m_curToken == TOKEN_IMPORT) {
      parseImport(this,(vector<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_> *)local_80);
    }
    else {
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&groupNode
                     ,"unexpected token while parsing shader group: ",&this->m_curTokenStr);
      parseError(this,(string *)&groupNode);
      std::__cxx11::string::~string((string *)&groupNode);
    }
  }
  advanceToken(this,TOKEN_END);
  iVar1 = (**this->m_caseFactory->_vptr_ShaderCaseFactory)
                    (this->m_caseFactory,local_38,
                     &children.super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage,local_80);
  local_b0 = (value_type)CONCAT44(extraout_var,iVar1);
  local_a8 = local_b0;
  std::vector<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>::push_back
            ((vector<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_> *)name.field_2._8_8_,
             &local_b0);
  std::vector<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>::~vector
            ((vector<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_> *)local_80);
  std::__cxx11::string::~string
            ((string *)
             &children.super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>._M_impl
              .super__Vector_impl_data._M_end_of_storage);
  std::__cxx11::string::~string(local_38);
  return;
}

Assistant:

void ShaderParser::parseShaderGroup (vector<tcu::TestNode*>& shaderNodeList)
{
	// Parse 'case'.
	PARSE_DBG(("  parseShaderGroup()\n"));
	advanceToken(TOKEN_GROUP);

	// Parse case name.
	string name = m_curTokenStr;
	advanceToken(); // \note [pyry] We don't want to check token type here (for instance to allow "uniform") group.

	// Parse description.
	assumeToken(TOKEN_STRING);
	string description = parseStringLiteral(m_curTokenStr.c_str());
	advanceToken(TOKEN_STRING);

	std::vector<tcu::TestNode*> children;

	// Parse group children.
	for (;;)
	{
		if (m_curToken == TOKEN_END)
			break;
		else if (m_curToken == TOKEN_GROUP)
			parseShaderGroup(children);
		else if (m_curToken == TOKEN_CASE)
			parseShaderCase(children);
		else if (m_curToken == TOKEN_IMPORT)
			parseImport(children);
		else
			parseError(string("unexpected token while parsing shader group: " + m_curTokenStr));
	}

	advanceToken(TOKEN_END); // group end

	// Create group node.
	tcu::TestCaseGroup* groupNode = m_caseFactory->createGroup(name, description, children);
	shaderNodeList.push_back(groupNode);
}